

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O1

bool __thiscall
httplib::SSLClient::verify_host_with_subject_alt_name(SSLClient *this,X509 *server_cert)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  GENERAL_NAMES *a;
  int *piVar4;
  char *pattern;
  undefined7 extraout_var;
  byte bVar5;
  ulong uVar6;
  int iVar7;
  undefined1 local_68 [8];
  in6_addr addr6;
  size_t local_50;
  undefined1 local_40 [4];
  int local_3c;
  in_addr addr;
  
  iVar2 = inet_pton(10,(this->super_ClientImpl).host_._M_dataplus._M_p,local_68);
  if (iVar2 == 0) {
    iVar2 = inet_pton(2,(this->super_ClientImpl).host_._M_dataplus._M_p,local_40);
    local_50 = (size_t)((uint)(iVar2 != 0) * 4);
    iVar2 = (uint)(iVar2 != 0) * 5 + 2;
  }
  else {
    iVar2 = 7;
    local_50 = 0x10;
  }
  bVar5 = 0;
  a = (GENERAL_NAMES *)X509_get_ext_d2i((X509 *)server_cert,0x55,(int *)0x0,(int *)0x0);
  if (a != (GENERAL_NAMES *)0x0) {
    local_3c = OPENSSL_sk_num(a);
    if (local_3c < 1) {
      bVar5 = 0;
    }
    else {
      iVar7 = 1;
      uVar6 = 0;
      bVar5 = 0;
      addr6.__in6_u._8_8_ = this;
      do {
        piVar4 = (int *)OPENSSL_sk_value(a,iVar7 + -1);
        if (*piVar4 == iVar2) {
          _addr = uVar6;
          pattern = (char *)ASN1_STRING_get0_data(*(undefined8 *)(piVar4 + 2));
          iVar3 = ASN1_STRING_length(*(ASN1_STRING **)(piVar4 + 2));
          if (iVar2 == 7) {
            iVar3 = bcmp(local_68,pattern,local_50);
            if ((iVar3 == 0) || (iVar3 = bcmp(local_40,pattern,local_50), uVar6 = _addr, iVar3 == 0)
               ) {
              bVar5 = 1;
              uVar6 = _addr;
            }
          }
          else {
            uVar6 = _addr;
            if (iVar2 == 2) {
              bVar1 = check_host_name((SSLClient *)addr6.__in6_u._8_8_,pattern,(long)iVar3);
              uVar6 = CONCAT71(extraout_var,bVar1);
            }
          }
        }
      } while ((iVar7 < local_3c) && (iVar7 = iVar7 + 1, (uVar6 & 1) == 0));
      bVar5 = (byte)uVar6 | bVar5;
    }
  }
  GENERAL_NAMES_free(a);
  return (bool)(bVar5 & 1);
}

Assistant:

inline bool
        SSLClient::verify_host_with_subject_alt_name(X509 * server_cert) const {
        auto ret = false;

        auto type = GEN_DNS;

        struct in6_addr addr6;
        struct in_addr addr;
        size_t addr_len = 0;

    #ifndef __MINGW32__
        if (inet_pton(AF_INET6, host_.c_str(), &addr6)) {
            type = GEN_IPADD;
            addr_len = sizeof(struct in6_addr);
        } else if (inet_pton(AF_INET, host_.c_str(), &addr)) {
            type = GEN_IPADD;
            addr_len = sizeof(struct in_addr);
        }
    #endif

        auto alt_names = static_cast<const struct stack_st_GENERAL_NAME*>(
            X509_get_ext_d2i(server_cert, NID_subject_alt_name, nullptr, nullptr));

        if (alt_names) {
            auto dsn_matched = false;
            auto ip_mached = false;

            auto count = sk_GENERAL_NAME_num(alt_names);

            for (decltype(count) i = 0; i < count && !dsn_matched; i++) {
                auto val = sk_GENERAL_NAME_value(alt_names, i);
                if (val->type == type) {
                    auto name = (const char*)ASN1_STRING_get0_data(val->d.ia5);
                    auto name_len = (size_t)ASN1_STRING_length(val->d.ia5);

                    switch (type) {
                        case GEN_DNS: dsn_matched = check_host_name(name, name_len); break;

                        case GEN_IPADD:
                            if (!memcmp(&addr6, name, addr_len) ||
                                !memcmp(&addr, name, addr_len)) {
                                ip_mached = true;
                            }
                            break;
                    }
                }
            }

            if (dsn_matched || ip_mached) { ret = true; }
        }

        GENERAL_NAMES_free((STACK_OF(GENERAL_NAME)*)alt_names);
        return ret;
    }